

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

int tclpkcs11_closesession(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  ProcErrorProc *pPVar1;
  Tcl_Obj *pTVar2;
  long lVar3;
  Tcl_Obj *tcl_handle;
  Tcl_HashEntry *tcl_handle_entry;
  tclpkcs11_handle *handle;
  tclpkcs11_interpdata *interpdata;
  Tcl_Obj **objv_local;
  int objc_local;
  Tcl_Interp *interp_local;
  ClientData cd_local;
  
  if (cd == (ClientData)0x0) {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar2 = (*tclStubsPtr->tcl_NewStringObj)("invalid clientdata",-1);
    (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar2);
    cd_local._4_4_ = 1;
  }
  else if (objc == 2) {
    lVar3 = (**(code **)((long)cd + 0x40))(cd,objv[1]);
    if (lVar3 == 0) {
      pPVar1 = tclStubsPtr->tcl_SetObjResult;
      pTVar2 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
      (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar2);
      cd_local._4_4_ = 1;
    }
    else if (*(tclpkcs11_handle **)(lVar3 + 0x18) == (tclpkcs11_handle *)0x0) {
      pPVar1 = tclStubsPtr->tcl_SetObjResult;
      pTVar2 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
      (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar2);
      cd_local._4_4_ = 1;
    }
    else {
      tclpkcs11_close_session(*(tclpkcs11_handle **)(lVar3 + 0x18));
      pPVar1 = tclStubsPtr->tcl_SetObjResult;
      pTVar2 = (*tclStubsPtr->tcl_NewIntObj)(1);
      (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar2);
      cd_local._4_4_ = 0;
    }
  }
  else {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar2 = (*tclStubsPtr->tcl_NewStringObj)
                       ("wrong # args: should be \"pki::pkcs11::closesession handle\"",-1);
    (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar2);
    cd_local._4_4_ = 1;
  }
  return cd_local._4_4_;
}

Assistant:

MODULE_SCOPE int tclpkcs11_closesession(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 2) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::closesession handle\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  /* Close the session, cleaning up all the session objects */
  tclpkcs11_close_session(handle);

  Tcl_SetObjResult(interp, Tcl_NewBooleanObj(1));

  return(TCL_OK);
}